

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

void Lcr_ManFree(Fra_Lcr_t *p)

{
  void **__ptr;
  void *__ptr_00;
  int iVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  if (p->fVerbose != 0) {
    Lcr_ManPrint(p);
  }
  pVVar3 = p->pAig->vCis;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      *(undefined8 *)pVVar3->pArray[lVar2] = 0;
      lVar2 = lVar2 + 1;
      pVVar3 = p->pAig->vCis;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = p->vFraigs;
  __ptr = pVVar3->pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(pVVar3);
  if (p->pCla != (Fra_Cla_t *)0x0) {
    Fra_ClassesStop(p->pCla);
  }
  pVVar3 = p->vParts;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar1 = pVVar3->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        __ptr_00 = pVVar3->pArray[lVar2];
        if (__ptr_00 != (void *)0x0) {
          if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr_00 + 8));
          }
          free(__ptr_00);
          iVar1 = pVVar3->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  if (p->pInToOutPart != (int *)0x0) {
    free(p->pInToOutPart);
    p->pInToOutPart = (int *)0x0;
  }
  if (p->pInToOutNum != (int *)0x0) {
    free(p->pInToOutNum);
  }
  free(p);
  return;
}

Assistant:

void Lcr_ManFree( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->fVerbose )
        Lcr_ManPrint( p );
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pNext = NULL;
    Vec_PtrFree( p->vFraigs );
    if ( p->pCla  )     Fra_ClassesStop( p->pCla );
    if ( p->vParts  )   Vec_VecFree( (Vec_Vec_t *)p->vParts );
    ABC_FREE( p->pInToOutPart );
    ABC_FREE( p->pInToOutNum );
    ABC_FREE( p );
}